

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * SySetPop(SySet *pSet)

{
  void *pData;
  char *zBase;
  SySet *pSet_local;
  
  if (pSet->nUsed == 0) {
    pSet_local = (SySet *)0x0;
  }
  else {
    pSet->nUsed = pSet->nUsed - 1;
    pSet_local = (SySet *)((long)pSet->pBase + (ulong)(pSet->nUsed * pSet->eSize));
  }
  return pSet_local;
}

Assistant:

JX9_PRIVATE void * SySetPop(SySet *pSet)
{
	const char *zBase;
	void *pData;
	if( pSet->nUsed <= 0 ){
		return 0;
	}
	zBase = (const char *)pSet->pBase;
	pSet->nUsed--;
	pData =  (void *)&zBase[pSet->nUsed * pSet->eSize]; 
	return pData;
}